

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcess.cpp
# Opt level: O1

Index __thiscall
MultiAgentDecisionProcess::GetAgentIndexByName(MultiAgentDecisionProcess *this,string *s)

{
  pointer pcVar1;
  size_t __n;
  int iVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  Index unaff_EBP;
  pointer pAVar5;
  bool bVar6;
  stringstream ss;
  allocator<char> local_1d9;
  char *local_1d8;
  long *local_1b8;
  size_t local_1b0;
  long local_1a8 [47];
  
  pAVar5 = (this->_m_agents).super__Vector_base<Agent,_std::allocator<Agent>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pAVar5 != (this->_m_agents).super__Vector_base<Agent,_std::allocator<Agent>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      pcVar1 = (pAVar5->super_NamedDescribedEntity)._m_name._M_dataplus._M_p;
      local_1b8 = local_1a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,pcVar1,
                 pcVar1 + (pAVar5->super_NamedDescribedEntity)._m_name._M_string_length);
      __n = s->_M_string_length;
      if (__n == local_1b0) {
        if (__n == 0) {
          bVar6 = true;
        }
        else {
          iVar2 = bcmp((s->_M_dataplus)._M_p,local_1b8,__n);
          bVar6 = iVar2 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (bVar6) {
        unaff_EBP = (pAVar5->super_DiscreteEntity)._m_index;
      }
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8,local_1a8[0] + 1);
      }
      if (bVar6) {
        return unaff_EBP;
      }
      pAVar5 = pAVar5 + 1;
    } while (pAVar5 != (this->_m_agents).super__Vector_base<Agent,_std::allocator<Agent>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"GetAgentIndexByName - agent \"",0x1d);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(s->_M_dataplus)._M_p,s->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," not found.",0xb);
  std::endl<char,std::char_traits<char>>(poVar3);
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar4 = &PTR__E_0059bd80;
  std::__cxx11::string::string<std::allocator<char>>((string *)(puVar4 + 1),local_1d8,&local_1d9);
  __cxa_throw(puVar4,&E::typeinfo,E::~E);
}

Assistant:

Index MultiAgentDecisionProcess::GetAgentIndexByName(const string &s) const	       
{
    vector<Agent>::const_iterator it;
    for(it = _m_agents.begin(); it != _m_agents.end(); it++)
    {
        string s2 = (*it).GetName();
        if(s == s2)
            return( (*it).GetIndex() );
    }
    //not found
    stringstream ss;
    ss << "GetAgentIndexByName - agent \"" << s << " not found." << endl;
    throw E(ss.str().c_str());
}